

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O1

void __thiscall
unodb::test::
tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
insert_internal(tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                *this,key_type k,value_view v,bool bypass_verifier)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  size_type i;
  long lVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  AssertionResult *this_01;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  long in_FS_OFFSET;
  bool bVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_bool>
  pVar5;
  unsigned_long uStack_168;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> growing_inodes_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_4UL>_> shrinking_inodes_before;
  non_atomic_array<const_std::array<std::atomic<unsigned_long>,_5UL>_> node_counts_before;
  value_view v_local;
  __int_type_conflict key_prefix_splits_before;
  __int_type_conflict local_a0;
  __int_type_conflict mem_use_before;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  __int_type_conflict leaf_count_after;
  undefined1 auStack_78 [7];
  bool empty_before;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  __int_type_conflict mem_use_after;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_40;
  AssertionResult gtest_ar_;
  
  node_counts_before._M_elems[4] = (unsigned_long)v._M_ptr;
  leaf_count_after._7_1_ = (this->test_db).root.value._M_i.tagged_ptr == 0;
  if (this->parallel_test == false) {
    local_a0 = (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
  }
  else {
    local_a0 = 0;
  }
  lVar2 = 0;
  do {
    shrinking_inodes_before._M_elems[lVar2 + 3] =
         (this->test_db).node_counts._M_elems[lVar2].super___atomic_base<unsigned_long>._M_i;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  lVar2 = 0;
  do {
    growing_inodes_before._M_elems[lVar2 + -1] =
         (this->test_db).growing_inode_counts._M_elems[lVar2].super___atomic_base<unsigned_long>.
         _M_i;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    growing_inodes_before._M_elems[lVar2 + 3] =
         (this->test_db).shrinking_inode_counts._M_elems[lVar2].super___atomic_base<unsigned_long>.
         _M_i;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::
  do_insert<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
            ((tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)this,k,v);
  _Var1._M_head_impl = local_40._M_head_impl;
  bVar4 = (this->test_db).root.value._M_i.tagged_ptr == 0;
  local_40._M_head_impl._0_1_ = !bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar4) {
    this_01 = &gtest_ar_;
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_78,(internal *)&local_40,(AssertionResult *)"test_db.empty()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x18b,_auStack_78);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)_auStack_78 != &gtest_ar.message_) {
      operator_delete(_auStack_78,
                      (long)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    gtest_ar._0_8_ = gtest_ar_._0_8_;
    if (gtest_ar_._0_8_ == 0) {
      return;
    }
    goto LAB_00138b1d;
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->test_db).current_memory_use.super___atomic_base<unsigned_long>._M_i;
  if (this->parallel_test == true) {
    local_40._M_head_impl = _Var1._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)auStack_78,"(mem_use_after)","(0)",(unsigned_long *)&local_50,
               (int *)&local_40);
    if (auStack_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,400,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_40);
      goto LAB_00138a85;
    }
LAB_0013881e:
    if (gtest_ar._0_8_ != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&gtest_ar,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar._0_8_);
    }
    local_88._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (this->test_db).node_counts._M_elems[0].super___atomic_base<unsigned_long>._M_i;
    if (this->parallel_test == true) {
      local_40._M_head_impl = local_40._M_head_impl & 0xffffffff00000000;
      testing::internal::CmpHelperGT<unsigned_long,int>
                ((internal *)auStack_78,"(leaf_count_after)","(0)",(unsigned_long *)&local_88,
                 (int *)&local_40);
      if (auStack_78[0] != (internal)0x0) {
LAB_001388e2:
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        if (bypass_verifier) {
          return;
        }
        allocation_failure_injector::fail_on_nth_allocation_.super___atomic_base<unsigned_long>._M_i
             = (__atomic_base<unsigned_long>)0;
        allocation_failure_injector::allocation_counter.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)0;
        *(undefined1 *)(in_FS_OFFSET + -7) = 1;
        _auStack_78 = (pointer)k;
        pVar5 = std::
                map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                ::try_emplace<std::span<std::byte_const,18446744073709551615ul>&>
                          ((map<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::test::tree_verifier<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::comparator,std::allocator<std::pair<unsigned_long_const,std::span<std::byte_const,18446744073709551615ul>>>>
                            *)&this->values,(key_type *)auStack_78,
                           (span<const_std::byte,_18446744073709551615UL> *)
                           (node_counts_before._M_elems + 4));
        local_40._M_head_impl._0_1_ = pVar5.second;
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          testing::Message::Message((Message *)&local_90);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)auStack_78,(internal *)&local_40,
                     (AssertionResult *)"insert_succeeded","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mem_use_before,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                     ,0x1a4,_auStack_78);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&mem_use_before,(Message *)&local_90);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mem_use_before);
          if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)_auStack_78 != &gtest_ar.message_) {
            operator_delete(_auStack_78,
                            (long)gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 1);
          }
          if (local_90._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_90._M_head_impl + 8))();
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
        }
        *(undefined1 *)(in_FS_OFFSET + -7) = 0;
        return;
      }
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x197,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_40);
    }
    else {
      local_40._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (shrinking_inodes_before._M_elems[3] + 1);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)auStack_78,"(leaf_count_after)",
                 "(node_counts_before[as_i<unodb::node_type::LEAF>] + 1)",(unsigned_long *)&local_88
                 ,(unsigned_long *)&local_40);
      if (auStack_78[0] != (internal)0x0) goto LAB_001388e2;
      testing::Message::Message((Message *)&local_40);
      if (gtest_ar._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,0x19a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_40);
    }
    this_00 = &local_90;
  }
  else {
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)auStack_78,"(mem_use_before)","(mem_use_after)",&local_a0,
               (unsigned_long *)&local_50);
    if (auStack_78[0] != (internal)0x0) goto LAB_0013881e;
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x192,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_40);
LAB_00138a85:
    this_00 = &local_88;
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  if (local_40._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  if (gtest_ar._0_8_ == 0) {
    return;
  }
  this_01 = &gtest_ar;
LAB_00138b1d:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_);
  return;
}

Assistant:

void insert_internal(key_type k, unodb::value_view v,
                       bool bypass_verifier = false) {
    const auto empty_before = test_db.empty();
#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_before =
        parallel_test ? 0 : test_db.get_current_memory_use();
    const auto node_counts_before = test_db.get_node_counts();
    const auto growing_inodes_before = test_db.get_growing_inode_counts();
    const auto shrinking_inodes_before = test_db.get_shrinking_inode_counts();
    const auto key_prefix_splits_before = test_db.get_key_prefix_splits();
#endif  // UNODB_DETAIL_WITH_STATS

    try {
      do_insert(k, v);
    } catch (...) {
      if (!parallel_test) {
        UNODB_ASSERT_EQ(empty_before, test_db.empty());
#ifdef UNODB_DETAIL_WITH_STATS
        UNODB_ASSERT_EQ(mem_use_before, test_db.get_current_memory_use());
        UNODB_ASSERT_THAT(test_db.get_node_counts(),
                          ::testing::ElementsAreArray(node_counts_before));
        UNODB_ASSERT_THAT(test_db.get_growing_inode_counts(),
                          ::testing::ElementsAreArray(growing_inodes_before));
        UNODB_ASSERT_THAT(test_db.get_shrinking_inode_counts(),
                          ::testing::ElementsAreArray(shrinking_inodes_before));
        UNODB_ASSERT_EQ(test_db.get_key_prefix_splits(),
                        key_prefix_splits_before);
#endif  // UNODB_DETAIL_WITH_STATS
      }
      throw;
    }

    UNODB_ASSERT_FALSE(test_db.empty());

#ifdef UNODB_DETAIL_WITH_STATS
    const auto mem_use_after = test_db.get_current_memory_use();
    if (parallel_test)
      UNODB_ASSERT_GT(mem_use_after, 0);
    else
      UNODB_ASSERT_LT(mem_use_before, mem_use_after);

    const auto leaf_count_after =
        test_db.template get_node_count<unodb::node_type::LEAF>();
    if (parallel_test)
      UNODB_ASSERT_GT(leaf_count_after, 0);
    else
      UNODB_ASSERT_EQ(leaf_count_after,
                      node_counts_before[as_i<unodb::node_type::LEAF>] + 1);
#endif  // UNODB_DETAIL_WITH_STATS

    if (!bypass_verifier) {
#ifndef NDEBUG
      allocation_failure_injector::reset();
#endif
      UNODB_DETAIL_PAUSE_HEAP_TRACKING_GUARD();
      const auto [pos, insert_succeeded] = values.try_emplace(to_ikey(k), v);
      (void)pos;
      UNODB_ASSERT_TRUE(insert_succeeded);
    }
  }